

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int template_find_field(t_template *x,t_symbol *name,int *p_onset,int *p_type,t_symbol **p_arraytype
                       )

{
  t_dataslot *ptVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (x == (t_template *)0x0) {
    bug("template_find_field");
  }
  else {
    uVar2 = (ulong)(uint)x->t_n;
    if (x->t_n < 1) {
      uVar2 = 0;
    }
    lVar3 = 0x10;
    for (lVar4 = 0; uVar2 * 8 != lVar4; lVar4 = lVar4 + 8) {
      ptVar1 = x->t_vec;
      if (*(t_symbol **)((long)ptVar1 + lVar3 + -8) == name) {
        *p_onset = (int)lVar4;
        *p_type = *(int *)((long)ptVar1 + lVar3 + -0x10);
        *p_arraytype = *(t_symbol **)((long)&ptVar1->ds_type + lVar3);
        return 1;
      }
      lVar3 = lVar3 + 0x18;
    }
  }
  return 0;
}

Assistant:

int template_find_field(t_template *x, t_symbol *name, int *p_onset,
    int *p_type, t_symbol **p_arraytype)
{
    t_template *t;
    int i, n;
    if (!x)
    {
        bug("template_find_field");
        return (0);
    }
    n = x->t_n;
    for (i = 0; i < n; i++)
        if (x->t_vec[i].ds_name == name)
    {
        *p_onset = i * sizeof(t_word);
        *p_type = x->t_vec[i].ds_type;
        *p_arraytype = x->t_vec[i].ds_arraytemplate;
        return (1);
    }
    return (0);
}